

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void fdump_action(FILE *out,stone_type stone,response_cache_element *resp,int a,char *indent)

{
  _proto_action *p_Var1;
  _proto_action *p_Var2;
  CMConnection_conflict p_Var3;
  long lVar4;
  void *__ptr;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  
  if ((resp != (response_cache_element *)0x0) && (resp->action_type == Action_NoAction)) {
    pcVar8 = "NO ACTION REGISTERED\n";
    sVar7 = 0x15;
    goto LAB_001338f3;
  }
  p_Var2 = stone->proto_actions;
  lVar5 = (long)a;
  p_Var1 = p_Var2 + lVar5;
  fprintf((FILE *)out," Action %d - %s  ",lVar5,action_str[p_Var2[lVar5].action_type]);
  switch(p_Var2[lVar5].data_state) {
  case Accepts_All:
    pcVar8 = "accepts any encode state\n";
    sVar7 = 0x19;
    break;
  case Requires_Decoded:
    pcVar8 = "requires decoded\n";
    sVar7 = 0x11;
    break;
  case Requires_Contig_Encoded:
    pcVar8 = "requires contiguous encoded\n";
    sVar7 = 0x1c;
    break;
  case Requires_Vector_Encoded:
    pcVar8 = "requires vector encoded\n";
    sVar7 = 0x18;
    break;
  default:
    goto switchD_001336c7_default;
  }
  fwrite(pcVar8,sVar7,1,(FILE *)out);
switchD_001336c7_default:
  fwrite("  expects formats ",0x12,1,(FILE *)out);
  if (p_Var1->matching_reference_formats == (FMFormat *)0x0) {
    fwrite(" NULL",5,1,(FILE *)out);
  }
  else if (*p_Var1->matching_reference_formats != (FMFormat)0x0) {
    lVar5 = 0;
    do {
      __ptr = (void *)global_name_of_FMFormat();
      fprintf((FILE *)out,"\"%s\" (%p), ",__ptr,
              *(undefined8 *)((long)p_Var1->matching_reference_formats + lVar5));
      free(__ptr);
      lVar4 = lVar5 + 8;
      lVar5 = lVar5 + 8;
    } while (*(long *)((long)p_Var1->matching_reference_formats + lVar4) != 0);
  }
  fputc(10,(FILE *)out);
  switch(p_Var1->action_type) {
  case Action_Bridge:
    pcVar8 = (p_Var1->o).bri.remote_path;
    pcVar6 = "NULL";
    if (pcVar8 != (char *)0x0) {
      pcVar6 = pcVar8;
    }
    fprintf((FILE *)out,"  Target: %s: connection %p, remote_stone_id %d\n",pcVar6,
            (p_Var1->o).term.handler,(ulong)(uint)(p_Var1->o).bri.remote_stone_id);
    p_Var3 = (p_Var1->o).bri.conn;
    if (p_Var3 != (CMConnection_conflict)0x0) {
      fdump_attr_list(out,p_Var3->attrs);
    }
    if ((p_Var1->o).bri.conn_failed == 0) {
      return;
    }
    pcVar8 = "Connection has FAILED!\n";
    sVar7 = 0x17;
    break;
  case Action_Thread_Bridge:
    fprintf((FILE *)out,"  Target: CManager %p, stone_id %d\n",(p_Var1->o).term.client_data,
            (ulong)(uint)(p_Var1->o).thr_bri.target_stone_id);
    if ((p_Var1->o).term.target_stone_id == 0) {
      return;
    }
    pcVar8 = "TARGET CM HAS SHUTDOWN!\n";
    sVar7 = 0x18;
    break;
  case Action_Terminal:
  case Action_Filter:
    return;
  case Action_Immediate:
    pcVar8 = "   Immediate action\n";
    sVar7 = 0x14;
    goto LAB_0013389e;
  case Action_Multi:
    pcVar8 = "   Multi action\n";
    sVar7 = 0x10;
LAB_0013389e:
    fwrite(pcVar8,sVar7,1,(FILE *)out);
    dump_mrd((p_Var1->o).term.handler);
    return;
  case Action_Decode:
    pcVar8 = "   Decoding action\n";
    sVar7 = 0x13;
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                  ,0x5c5,
                  "void fdump_action(FILE *, stone_type, response_cache_element *, int, const char *)"
                 );
  case Action_Split:
    pcVar8 = "    Split action\n";
    sVar7 = 0x11;
    break;
  case Action_Store:
    fprintf((FILE *)out,"   Store action: %d/%d items\n",
            (ulong)(uint)(p_Var1->o).term.target_stone_id,(ulong)(uint)(p_Var1->o).store.max_stored)
    ;
  case Action_NoAction:
    pcVar8 = "   NoAction\n";
    sVar7 = 0xc;
  }
LAB_001338f3:
  fwrite(pcVar8,sVar7,1,(FILE *)out);
  return;
}

Assistant:

static void
fdump_action(FILE* out, stone_type stone, response_cache_element *resp, int a, const char *indent)
{
    proto_action *act;
    (void)indent;
    if ((resp != NULL) && (resp->action_type == Action_NoAction)) {
	fprintf(out, "NO ACTION REGISTERED\n");
	return;
    }
    act = &stone->proto_actions[a];
    fprintf(out, " Action %d - %s  ", a, action_str[act->action_type]);
    if (act->data_state == Accepts_All) {
	fprintf(out, "accepts any encode state\n");
    } else if (act->data_state == Requires_Decoded) {
	fprintf(out, "requires decoded\n");
    } else if (act->data_state == Requires_Contig_Encoded) {
	fprintf(out, "requires contiguous encoded\n");
    } else if (act->data_state == Requires_Vector_Encoded) {
	fprintf(out, "requires vector encoded\n");
    }
    fprintf(out, "  expects formats ");
    if (act->matching_reference_formats) {
	int i = 0;
	while (act->matching_reference_formats[i] != NULL) {
	    char *tmp;
	    fprintf(out, "\"%s\" (%p), ", tmp = global_name_of_FMFormat(act->matching_reference_formats[i]), act->matching_reference_formats[i]);
	    i++;
	    free(tmp);
	}
    } else {
	fprintf(out, " NULL");
    }
    fprintf(out, "\n");
    switch(act->action_type) {
    case Action_Bridge:
	fprintf(out, "  Target: %s: connection %p, remote_stone_id %d\n",
	       (act->o.bri.remote_path ? act->o.bri.remote_path : "NULL" ),
	       (void*)act->o.bri.conn, act->o.bri.remote_stone_id);
	if (act->o.bri.conn != NULL) fdump_attr_list(out, act->o.bri.conn->attrs);
	if (act->o.bri.conn_failed) fprintf(out, "Connection has FAILED!\n");
	break;
    case Action_Thread_Bridge:
	fprintf(out, "  Target: CManager %p, stone_id %d\n",
	       act->o.thr_bri.target_cm, act->o.thr_bri.target_stone_id);
	if (act->o.thr_bri.target_cm_shutdown) fprintf(out, "TARGET CM HAS SHUTDOWN!\n");
	break;
    case Action_Terminal:
	break;
    case Action_Filter:
/*	printf("  Filter proto action number %d\n",
	act->proto_action_id);*/
	break;
    case Action_Decode:
	fprintf(out, "   Decoding action\n");
	break;
    case Action_Split:
	fprintf(out, "    Split action\n");
	break;
    case Action_Immediate: 
	fprintf(out, "   Immediate action\n");
	dump_mrd(act->o.imm.mutable_response_data);
	break;
    case Action_Store:
        fprintf(out, "   Store action: %d/%d items\n", act->o.store.num_stored, 
                    act->o.store.max_stored);
    case Action_NoAction:
	fprintf(out, "   NoAction\n");
	break;
    case Action_Multi:
	fprintf(out, "   Multi action\n");
	dump_mrd(act->o.imm.mutable_response_data);
	break;
    default:
	assert(FALSE);
    }
}